

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_inspect_chunk(LodePNGState *state,size_t pos,uchar *in,size_t insize)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *in_RCX;
  size_t in_RDX;
  uchar *in_RSI;
  LodePNGInfo *in_RDI;
  uint error;
  uint unhandled;
  uchar *data;
  uchar *in_stack_00000010;
  uint chunkLength;
  uchar *chunk;
  uint uVar4;
  int iVar5;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  puVar3 = in_RSI + in_RDX;
  iVar5 = 0;
  uVar4 = 0;
  if (in_RCX < in_RSI + 4) {
    uVar4 = 0x1e;
  }
  else {
    uVar2 = lodepng_chunk_length((uchar *)0x12da9d);
    if (uVar2 < 0x80000000) {
      puVar3 = lodepng_chunk_data_const(puVar3);
      if (in_RCX + in_RDX < puVar3 + (ulong)uVar2 + 4) {
        uVar4 = 0x1e;
      }
      else {
        uVar1 = lodepng_chunk_type_equals
                          ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),(char *)puVar3);
        if (uVar1 == '\0') {
          uVar1 = lodepng_chunk_type_equals
                            ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),(char *)puVar3);
          if (uVar1 == '\0') {
            uVar1 = lodepng_chunk_type_equals
                              ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),(char *)puVar3);
            if (uVar1 == '\0') {
              uVar1 = lodepng_chunk_type_equals
                                ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),(char *)puVar3);
              if (uVar1 == '\0') {
                uVar1 = lodepng_chunk_type_equals
                                  ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),(char *)puVar3
                                  );
                if (uVar1 == '\0') {
                  uVar1 = lodepng_chunk_type_equals
                                    ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                     (char *)puVar3);
                  if (uVar1 == '\0') {
                    uVar1 = lodepng_chunk_type_equals
                                      ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                       (char *)puVar3);
                    if (uVar1 == '\0') {
                      uVar1 = lodepng_chunk_type_equals
                                        ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                         (char *)puVar3);
                      if (uVar1 == '\0') {
                        uVar1 = lodepng_chunk_type_equals
                                          ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                           (char *)puVar3);
                        if (uVar1 == '\0') {
                          uVar1 = lodepng_chunk_type_equals
                                            ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                             (char *)puVar3);
                          if (uVar1 == '\0') {
                            uVar1 = lodepng_chunk_type_equals
                                              ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                               (char *)puVar3);
                            if (uVar1 == '\0') {
                              uVar1 = lodepng_chunk_type_equals
                                                ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                                 (char *)puVar3);
                              if (uVar1 == '\0') {
                                iVar5 = 1;
                              }
                              else {
                                uVar4 = readChunk_iCCP((LodePNGInfo *)
                                                       CONCAT44(in_stack_fffffffffffffffc,
                                                                in_stack_fffffffffffffff8),
                                                       (LodePNGDecompressSettings *)in_RDI,in_RSI,
                                                       in_RDX);
                              }
                            }
                            else {
                              uVar4 = readChunk_sRGB((LodePNGInfo *)&in_RDI->chrm_white_x,puVar3,
                                                     (ulong)uVar2);
                            }
                          }
                          else {
                            uVar4 = readChunk_cHRM((LodePNGInfo *)&in_RDI->chrm_white_x,puVar3,
                                                   (ulong)uVar2);
                          }
                        }
                        else {
                          uVar4 = readChunk_gAMA((LodePNGInfo *)&in_RDI->chrm_white_x,puVar3,
                                                 (ulong)uVar2);
                        }
                      }
                      else {
                        uVar4 = readChunk_pHYs((LodePNGInfo *)&in_RDI->chrm_white_x,puVar3,
                                               (ulong)uVar2);
                      }
                    }
                    else {
                      uVar4 = readChunk_tIME((LodePNGInfo *)&in_RDI->chrm_white_x,puVar3,
                                             (ulong)uVar2);
                    }
                  }
                  else {
                    uVar4 = readChunk_iTXt((LodePNGInfo *)insize,(LodePNGDecompressSettings *)chunk,
                                           in_stack_00000010,(size_t)data);
                  }
                }
                else {
                  uVar4 = readChunk_zTXt(_error,(LodePNGDecompressSettings *)
                                                CONCAT44(in_stack_fffffffffffffffc,
                                                         in_stack_fffffffffffffff8),(uchar *)in_RDI,
                                         (size_t)in_RSI);
                }
              }
              else {
                uVar4 = readChunk_tEXt(in_RDI,in_RSI,in_RDX);
              }
            }
            else {
              uVar4 = readChunk_bKGD((LodePNGInfo *)&in_RDI->chrm_white_x,puVar3,(ulong)uVar2);
            }
          }
          else {
            uVar4 = readChunk_tRNS((LodePNGColorMode *)&in_RDI->chrm_green_x,puVar3,(ulong)uVar2);
          }
        }
        else {
          uVar4 = readChunk_PLTE((LodePNGColorMode *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                 puVar3,CONCAT44(iVar5,uVar4));
        }
        if ((((uVar4 == 0) && (iVar5 == 0)) && ((in_RDI->color).key_defined == 0)) &&
           (uVar2 = lodepng_chunk_check_crc((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffc8)),
           uVar2 != 0)) {
          uVar4 = 0x39;
        }
      }
    }
    else {
      uVar4 = 0x3f;
    }
  }
  return uVar4;
}

Assistant:

unsigned lodepng_inspect_chunk(LodePNGState* state, size_t pos,
                               const unsigned char* in, size_t insize) {
  const unsigned char* chunk = in + pos;
  unsigned chunkLength;
  const unsigned char* data;
  unsigned unhandled = 0;
  unsigned error = 0;

  if (pos + 4 > insize) return 30;
  chunkLength = lodepng_chunk_length(chunk);
  if(chunkLength > 2147483647) return 63;
  data = lodepng_chunk_data_const(chunk);
  if(data + chunkLength + 4 > in + insize) return 30;

  if(lodepng_chunk_type_equals(chunk, "PLTE")) {
    error = readChunk_PLTE(&state->info_png.color, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "tRNS")) {
    error = readChunk_tRNS(&state->info_png.color, data, chunkLength);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  } else if(lodepng_chunk_type_equals(chunk, "bKGD")) {
    error = readChunk_bKGD(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "tEXt")) {
    error = readChunk_tEXt(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "zTXt")) {
    error = readChunk_zTXt(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "iTXt")) {
    error = readChunk_iTXt(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "tIME")) {
    error = readChunk_tIME(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "pHYs")) {
    error = readChunk_pHYs(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "gAMA")) {
    error = readChunk_gAMA(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "cHRM")) {
    error = readChunk_cHRM(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "sRGB")) {
    error = readChunk_sRGB(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "iCCP")) {
    error = readChunk_iCCP(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  } else {
    /* unhandled chunk is ok (is not an error) */
    unhandled = 1;
  }

  if(!error && !unhandled && !state->decoder.ignore_crc) {
    if(lodepng_chunk_check_crc(chunk)) return 57; /*invalid CRC*/
  }

  return error;
}